

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O1

void absl::CleanupFlags(void)

{
  FlagList *this;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>_>_>
  *this_00;
  
  if (CleanupFlags()::is_shutdown == '\0') {
    this = internal::anon_unknown_1::GetFlagList();
    if (this != (FlagList *)0x0) {
      std::
      vector<std::shared_ptr<absl::internal::FlagFunc>,_std::allocator<std::shared_ptr<absl::internal::FlagFunc>_>_>
      ::~vector(this);
      operator_delete(this,0x18);
    }
    this_00 = &internal::(anonymous_namespace)::GetFlagMap_abi_cxx11_()->_M_t;
    if (this_00 !=
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>_>_>
         *)0x0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>_>_>
      ::~_Rb_tree(this_00);
      operator_delete(this_00,0x30);
    }
    CleanupFlags()::is_shutdown = '\x01';
  }
  return;
}

Assistant:

void CleanupFlags() {
  static bool is_shutdown = false;
  if (!is_shutdown) {
    delete internal::GetFlagList();
    delete internal::GetFlagMap();
    is_shutdown = true;
  }
}